

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRFakeTrackerDevice.cpp
# Opt level: O1

void __thiscall
MinVR::VRFakeTrackerDevice::onVREvent(VRFakeTrackerDevice *this,VRDataIndex *eventData)

{
  VRVector3 *this_00;
  pointer pcVar1;
  float fVar2;
  pointer pcVar3;
  int iVar4;
  VRAnyCoreType VVar5;
  float *pfVar6;
  VRMatrix4 *this_01;
  bool bVar7;
  float xx;
  VRDataIndex di;
  VRFloatArray screenPos;
  VRPoint3 here;
  VRVector3 up;
  VRVector3 over;
  undefined1 local_318 [152];
  VRMatrix4 local_280;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float *local_220;
  float *local_218;
  long local_210;
  VRFloatArray local_208;
  VRMatrix4 local_1f0;
  string local_1a8;
  VRPoint3 local_188;
  VRVector3 local_170;
  float local_158;
  float fStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  VRVector3 local_140;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  VRMatrix4 local_108;
  VRDataIndex local_c0;
  
  pcVar1 = local_318 + 0x10;
  pcVar3 = (eventData->_indexName)._M_dataplus._M_p;
  local_318._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_318,pcVar3,pcVar3 + (eventData->_indexName)._M_string_length);
  if (local_318._8_8_ == (this->_toggleEvent)._M_string_length) {
    if (local_318._8_8_ == 0) {
      bVar7 = true;
    }
    else {
      iVar4 = bcmp((void *)local_318._0_8_,(this->_toggleEvent)._M_dataplus._M_p,local_318._8_8_);
      bVar7 = iVar4 == 0;
    }
  }
  else {
    bVar7 = false;
  }
  if ((pointer)local_318._0_8_ != pcVar1) {
    operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
  }
  if (bVar7) {
    bVar7 = this->_tracking;
    this->_tracking = (bool)(bVar7 ^ 1);
    if (bVar7 != false) {
      return;
    }
    if (this->_sticky == true) {
LAB_00156d67:
      this->_state = XYTranslating;
      return;
    }
LAB_00157278:
    this->_state = None;
    return;
  }
  pcVar3 = (eventData->_indexName)._M_dataplus._M_p;
  local_318._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_318,pcVar3,pcVar3 + (eventData->_indexName)._M_string_length);
  if (local_318._8_8_ == (this->_translateZOnEvent)._M_string_length) {
    if (local_318._8_8_ == 0) {
      bVar7 = true;
    }
    else {
      iVar4 = bcmp((void *)local_318._0_8_,(this->_translateZOnEvent)._M_dataplus._M_p,
                   local_318._8_8_);
      bVar7 = iVar4 == 0;
    }
  }
  else {
    bVar7 = false;
  }
  if ((pointer)local_318._0_8_ != pcVar1) {
    operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
  }
  if (bVar7) {
    if (this->_state != ZTranslating) {
      this->_state = ZTranslating;
      return;
    }
    goto LAB_00157278;
  }
  pcVar3 = (eventData->_indexName)._M_dataplus._M_p;
  local_318._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_318,pcVar3,pcVar3 + (eventData->_indexName)._M_string_length);
  if (local_318._8_8_ == (this->_translateOnEvent)._M_string_length) {
    if (local_318._8_8_ == 0) {
      bVar7 = true;
    }
    else {
      iVar4 = bcmp((void *)local_318._0_8_,(this->_translateOnEvent)._M_dataplus._M_p,
                   local_318._8_8_);
      bVar7 = iVar4 == 0;
    }
  }
  else {
    bVar7 = false;
  }
  if ((pointer)local_318._0_8_ != pcVar1) {
    operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
  }
  if (bVar7) {
    if (this->_state != XYTranslating) goto LAB_00156d67;
    goto LAB_00157278;
  }
  pcVar3 = (eventData->_indexName)._M_dataplus._M_p;
  local_318._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_318,pcVar3,pcVar3 + (eventData->_indexName)._M_string_length);
  if (local_318._8_8_ == (this->_rotateOnEvent)._M_string_length) {
    if (local_318._8_8_ == 0) {
      bVar7 = true;
    }
    else {
      iVar4 = bcmp((void *)local_318._0_8_,(this->_rotateOnEvent)._M_dataplus._M_p,local_318._8_8_);
      bVar7 = iVar4 == 0;
    }
  }
  else {
    bVar7 = false;
  }
  if ((pointer)local_318._0_8_ != pcVar1) {
    operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
  }
  if (bVar7) {
    if (this->_state != Rotating) {
      this->_state = Rotating;
      return;
    }
    goto LAB_00157278;
  }
  pcVar3 = (eventData->_indexName)._M_dataplus._M_p;
  local_318._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_318,pcVar3,pcVar3 + (eventData->_indexName)._M_string_length);
  if (local_318._8_8_ == (this->_rollOnEvent)._M_string_length) {
    if (local_318._8_8_ == 0) {
      bVar7 = true;
    }
    else {
      iVar4 = bcmp((void *)local_318._0_8_,(this->_rollOnEvent)._M_dataplus._M_p,local_318._8_8_);
      bVar7 = iVar4 == 0;
    }
  }
  else {
    bVar7 = false;
  }
  if ((pointer)local_318._0_8_ != pcVar1) {
    operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
  }
  if (bVar7) {
    if (this->_state != Rolling) {
      this->_state = Rolling;
      return;
    }
    goto LAB_00157278;
  }
  pcVar3 = (eventData->_indexName)._M_dataplus._M_p;
  local_318._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_318,pcVar3,pcVar3 + (eventData->_indexName)._M_string_length);
  if ((local_318._8_8_ == (this->_translateZOffEvent)._M_string_length) &&
     ((local_318._8_8_ == 0 ||
      (iVar4 = bcmp((void *)local_318._0_8_,(this->_translateZOffEvent)._M_dataplus._M_p,
                    local_318._8_8_), iVar4 == 0)))) {
    bVar7 = this->_sticky;
    if ((pointer)local_318._0_8_ != pcVar1) {
      operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
    }
    if (bVar7 == false) goto LAB_00157278;
  }
  else if ((pointer)local_318._0_8_ != pcVar1) {
    operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
  }
  pcVar3 = (eventData->_indexName)._M_dataplus._M_p;
  local_318._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_318,pcVar3,pcVar3 + (eventData->_indexName)._M_string_length);
  if ((local_318._8_8_ == (this->_translateOffEvent)._M_string_length) &&
     ((local_318._8_8_ == 0 ||
      (iVar4 = bcmp((void *)local_318._0_8_,(this->_translateOffEvent)._M_dataplus._M_p,
                    local_318._8_8_), iVar4 == 0)))) {
    bVar7 = this->_sticky;
    if ((pointer)local_318._0_8_ != pcVar1) {
      operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
    }
    if (bVar7 == false) goto LAB_00157278;
  }
  else if ((pointer)local_318._0_8_ != pcVar1) {
    operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
  }
  pcVar3 = (eventData->_indexName)._M_dataplus._M_p;
  local_318._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_318,pcVar3,pcVar3 + (eventData->_indexName)._M_string_length);
  if ((local_318._8_8_ == (this->_rotateOffEvent)._M_string_length) &&
     ((local_318._8_8_ == 0 ||
      (iVar4 = bcmp((void *)local_318._0_8_,(this->_rotateOffEvent)._M_dataplus._M_p,local_318._8_8_
                   ), iVar4 == 0)))) {
    bVar7 = this->_sticky;
    if ((pointer)local_318._0_8_ != pcVar1) {
      operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
    }
    if (bVar7 == false) goto LAB_00157278;
  }
  else if ((pointer)local_318._0_8_ != pcVar1) {
    operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
  }
  pcVar3 = (eventData->_indexName)._M_dataplus._M_p;
  local_318._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_318,pcVar3,pcVar3 + (eventData->_indexName)._M_string_length);
  if ((local_318._8_8_ == (this->_rollOffEvent)._M_string_length) &&
     ((local_318._8_8_ == 0 ||
      (iVar4 = bcmp((void *)local_318._0_8_,(this->_rollOffEvent)._M_dataplus._M_p,local_318._8_8_),
      iVar4 == 0)))) {
    bVar7 = this->_sticky;
    if ((pointer)local_318._0_8_ != pcVar1) {
      operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
    }
    if (bVar7 == false) goto LAB_00157278;
  }
  else if ((pointer)local_318._0_8_ != pcVar1) {
    operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
  }
  pcVar3 = (eventData->_indexName)._M_dataplus._M_p;
  local_318._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_318,pcVar3,pcVar3 + (eventData->_indexName)._M_string_length);
  iVar4 = std::__cxx11::string::compare((char *)local_318);
  if ((pointer)local_318._0_8_ != pcVar1) {
    operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
  }
  if (iVar4 != 0) {
    return;
  }
  local_318._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"NormalizedPosition","");
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
  VVar5 = VRDataIndex::getValue(eventData,(string *)local_318,&local_1a8,true);
  (*(VVar5.datum)->_vptr_VRDatum[0xd])(&local_220,VVar5.datum);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_318._0_8_ != pcVar1) {
    operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
  }
  if (local_220 == local_218) goto LAB_001577b4;
  fStack_154 = (1.0 - local_220[1]) + -0.5;
  local_158 = *local_220 + -0.5 + *local_220 + -0.5;
  fStack_154 = fStack_154 + fStack_154;
  uStack_150 = 0;
  uStack_14c = 0;
  if (this->_tracking != true) goto LAB_001577a5;
  if (Rolling < this->_state) goto LAB_001576cd;
  local_238 = fStack_154 - this->_lastMouseY;
  xx = local_158 - this->_lastMouseX;
  fStack_234 = fStack_154;
  fStack_230 = fStack_154;
  fStack_22c = fStack_154;
  switch(this->_state) {
  case XYTranslating:
    if (this->_seeker == true) {
      fVar2 = this->_xyScale;
      VRVector3::VRVector3((VRVector3 *)&local_1f0,xx,0.0,local_238);
      operator*((VRVector3 *)&local_280,fVar2,(VRVector3 *)&local_1f0);
      operator+((VRVector3 *)local_318,(VRVector3 *)&local_280,&this->_statePos);
      VRVector3::operator=(&this->_statePos,(VRVector3 *)local_318);
    }
    else {
      fVar2 = this->_xyScale;
      VRVector3::VRVector3((VRVector3 *)&local_1f0,xx,local_238,0.0);
      operator*((VRVector3 *)&local_280,fVar2,(VRVector3 *)&local_1f0);
      operator+((VRVector3 *)local_318,(VRVector3 *)&local_280,&this->_statePos);
      VRVector3::operator=(&this->_statePos,(VRVector3 *)local_318);
    }
    VRVector3::~VRVector3((VRVector3 *)local_318);
    VRVector3::~VRVector3((VRVector3 *)&local_280);
    this_01 = &local_1f0;
    break;
  case ZTranslating:
    if (this->_seeker == true) {
      VRVector3::VRVector3((VRVector3 *)&local_280,0.0,local_238 * this->_zScale,0.0);
      operator+((VRVector3 *)local_318,(VRVector3 *)&local_280,&this->_statePos);
      VRVector3::operator=(&this->_statePos,(VRVector3 *)local_318);
    }
    else {
      VRVector3::VRVector3((VRVector3 *)&local_280,0.0,0.0,local_238 * this->_zScale);
      operator+((VRVector3 *)local_318,(VRVector3 *)&local_280,&this->_statePos);
      VRVector3::operator=(&this->_statePos,(VRVector3 *)local_318);
    }
    VRVector3::~VRVector3((VRVector3 *)local_318);
    this_01 = &local_280;
    break;
  case Rotating:
    VRMatrix4::VRMatrix4((VRMatrix4 *)local_318);
    if (this->_seeker == true) {
      VRVector3::VRVector3((VRVector3 *)&local_280,0.0,1.0,0.0);
      operator*(&local_170,&this->_stateRot,(VRVector3 *)&local_280);
      VRVector3::~VRVector3((VRVector3 *)&local_280);
      this_00 = &this->_statePos;
      pfVar6 = VRVector3::operator[](this_00,0);
      local_118 = ZEXT416((uint)*pfVar6);
      pfVar6 = VRVector3::operator[](this_00,1);
      local_128 = ZEXT416((uint)*pfVar6);
      pfVar6 = VRVector3::operator[](this_00,2);
      VRPoint3::VRPoint3(&local_188,-(float)local_118._0_4_,-(float)local_128._0_4_,-*pfVar6);
      VRVector3::cross(&local_140,&local_170,this_00);
      VRMatrix4::rotation(&local_1f0,&local_188,&local_170,xx * this->_rScale);
      VRMatrix4::rotation(&local_108,&local_188,&local_140,local_238 * this->_rScale);
      operator*(&local_280,&local_1f0,&local_108);
      VRMatrix4::operator=((VRMatrix4 *)local_318,&local_280);
      VRMatrix4::~VRMatrix4(&local_280);
      VRMatrix4::~VRMatrix4(&local_108);
      VRMatrix4::~VRMatrix4(&local_1f0);
      VRVector3::~VRVector3(&local_140);
      VRPoint3::~VRPoint3(&local_188);
      VRVector3::~VRVector3(&local_170);
    }
    else {
      VRMatrix4::rotationY(&local_1f0,xx * this->_rScale);
      VRMatrix4::rotationX(&local_108,local_238 * -this->_rScale);
      operator*(&local_280,&local_1f0,&local_108);
      VRMatrix4::operator=((VRMatrix4 *)local_318,&local_280);
      VRMatrix4::~VRMatrix4(&local_280);
      VRMatrix4::~VRMatrix4(&local_108);
      VRMatrix4::~VRMatrix4(&local_1f0);
    }
    operator*(&local_280,(VRMatrix4 *)local_318,&this->_stateRot);
    VRMatrix4::operator=(&this->_stateRot,&local_280);
    goto LAB_001576b6;
  case Rolling:
    VRMatrix4::rotationZ((VRMatrix4 *)local_318,xx * this->_rScale);
    operator*(&local_280,(VRMatrix4 *)local_318,&this->_stateRot);
    VRMatrix4::operator=(&this->_stateRot,&local_280);
LAB_001576b6:
    VRMatrix4::~VRMatrix4(&local_280);
    VRMatrix4::~VRMatrix4((VRMatrix4 *)local_318);
    goto LAB_001576cd;
  }
  VRVector3::~VRVector3((VRVector3 *)this_01);
LAB_001576cd:
  VRMatrix4::translation(&local_280,&this->_statePos);
  operator*((VRMatrix4 *)local_318,&local_280,&this->_stateRot);
  VRMatrix4::operator=(&this->_transform,(VRMatrix4 *)local_318);
  VRMatrix4::~VRMatrix4((VRMatrix4 *)local_318);
  VRMatrix4::~VRMatrix4(&local_280);
  VRMatrix4::toVRFloatArray(&local_208,&this->_transform);
  VRTrackerEvent::createValidDataIndex((VRDataIndex *)local_318,&this->_eventName,&local_208);
  if (local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  VRDataIndex::VRDataIndex(&local_c0,(VRDataIndex *)local_318);
  VRDataQueue::push(&this->_pendingEvents,&local_c0);
  VRDataIndex::~VRDataIndex(&local_c0);
  VRDataIndex::~VRDataIndex((VRDataIndex *)local_318);
LAB_001577a5:
  this->_lastMouseX = local_158;
  this->_lastMouseY = fStack_154;
LAB_001577b4:
  if (local_220 != (float *)0x0) {
    operator_delete(local_220,local_210 - (long)local_220);
  }
  return;
}

Assistant:

void VRFakeTrackerDevice::onVREvent(const VRDataIndex &eventData)
{
  if (eventData.getName() == _toggleEvent) {
    _tracking = !_tracking;
    if (_tracking) {
      if (_sticky) {
        _state = VRFakeTrackerDevice::XYTranslating;
      } else {
        _state = VRFakeTrackerDevice::None;
      }
    }
  }
  else if (eventData.getName() == _translateZOnEvent) {
    if (_state !=  VRFakeTrackerDevice::ZTranslating) {
      _state = VRFakeTrackerDevice::ZTranslating;
    } else {
      _state = VRFakeTrackerDevice::None;
    }
  }
  else if (eventData.getName() == _translateOnEvent) {
    if (_state != VRFakeTrackerDevice::XYTranslating) {
      _state = VRFakeTrackerDevice::XYTranslating;
    } else {
      _state = VRFakeTrackerDevice::None;
    }
  }
  else if (eventData.getName() == _rotateOnEvent) {
    if (_state != VRFakeTrackerDevice::Rotating) {
      _state = VRFakeTrackerDevice::Rotating;
    } else {
      _state = VRFakeTrackerDevice::None;
    }
  }
  else if (eventData.getName() == _rollOnEvent) {
    if (_state != VRFakeTrackerDevice::Rolling) {
      _state = VRFakeTrackerDevice::Rolling;
    } else {
      _state = VRFakeTrackerDevice::None;
    }
  }
  else if (eventData.getName() == _translateZOffEvent && !_sticky) {
    _state = VRFakeTrackerDevice::None;
  }
  else if (eventData.getName() == _translateOffEvent && !_sticky) {
    _state = VRFakeTrackerDevice::None;
  }
  else if (eventData.getName() == _rotateOffEvent && !_sticky) {
    _state = VRFakeTrackerDevice::None;
  }
  else if (eventData.getName() == _rollOffEvent && !_sticky) {
    _state = VRFakeTrackerDevice::None;
  }
  else if (eventData.getName() == "Mouse_Move") {
    const VRFloatArray screenPos = eventData.getValue("NormalizedPosition");
    if (!screenPos.empty()) {

      // Transform range from [0,1] to [-1,1].
      float mousex = 2.0f * (screenPos[0] - 0.5f);
      float mousey = 2.0f * ((1.0f - screenPos[1]) - 0.5f);

      // If we're not currently tracking, ignore the mouse.
      if (_tracking) {
        float deltaX = mousex - _lastMouseX;
        float deltaY = mousey - _lastMouseY;

        if (_state == VRFakeTrackerDevice::ZTranslating) {
          // If we're Z translating, that's up and down in the seeker mode, but
          // forward and backward in the looker mode.
          if (_seeker) {
            _statePos =  VRVector3(0, _zScale * deltaY, 0) + _statePos;
          } else {
            _statePos =  VRVector3(0, 0, _zScale * deltaY) + _statePos;
          }
        }
        else if (_state == VRFakeTrackerDevice::Rotating) {
          // The seeker mode turns the viewer around in place, while the looker
          // mode rotates the object in front of the viewer.  More or less.

          VRMatrix4 r;

          if (_seeker) {
            VRVector3 up = _stateRot * VRVector3(0.0f, 1.0f, 0.0f);
            // Not sure why these coordinates have to be negated.
            VRPoint3 here = VRPoint3(-_statePos[0], -_statePos[1], -_statePos[2]);
            VRVector3 over = up.cross(_statePos);

            r = VRMatrix4::rotation(here, up, _rScale * deltaX) *
              VRMatrix4::rotation(here, over, _rScale * deltaY);

          } else {
            r = VRMatrix4::rotationY(_rScale * deltaX) *
              VRMatrix4::rotationX(-_rScale * deltaY);
          }
          _stateRot = r * _stateRot;
        }
        else if (_state == VRFakeTrackerDevice::Rolling) {
          VRMatrix4 r = VRMatrix4::rotationZ(_rScale * deltaX);
          _stateRot = r * _stateRot;
        }
        else if (_state == VRFakeTrackerDevice::XYTranslating){
          // The seeker mode moves us in the horizontal plane, while the looker
          // mode moves us in a vertical plane.
          if (_seeker) {
            _statePos =  _xyScale * VRVector3(deltaX, 0, deltaY) + _statePos;
          } else {
            _statePos =  _xyScale * VRVector3(deltaX, deltaY, 0) + _statePos;
          }
        }

        _transform = VRMatrix4::translation(_statePos) * _stateRot;

        VRDataIndex di = VRTrackerEvent::createValidDataIndex(_eventName, _transform.toVRFloatArray());
        _pendingEvents.push(di);
      }

      _lastMouseX = mousex;
      _lastMouseY = mousey;
    }
  }
}